

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::EmitPropTypeof
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  Scope *symScope;
  code *pcVar1;
  ByteCodeGenerator *pBVar2;
  bool bVar3;
  ushort uVar4;
  OpCode op;
  PropertyId PVar5;
  uint uVar6;
  RegSlot RVar7;
  ByteCodeLabel labelID;
  Scope **ppSVar8;
  undefined4 *puVar9;
  Scope *scope;
  Type *pTVar10;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 scopeLocation;
  FuncInfo *this_00;
  uint32 slotId;
  int i;
  int index;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 aVar11;
  FuncInfo *pFVar12;
  ByteCodeWriter *this_01;
  undefined1 local_b8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  DynamicLoadRecord local_6c;
  undefined4 *local_60;
  Symbol *local_58;
  PropertyId local_50;
  char local_4b;
  ProfileId local_4a;
  PropertyId envIndex;
  FuncInfo *local_40;
  RegSlot local_34;
  
  local_50 = -1;
  ppSVar8 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar8 = &this->globalScope;
  }
  symScope = *ppSVar8;
  _envIndex = this;
  local_34 = lhsLocation;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1589,"(symScope)","symScope");
    if (!bVar3) goto LAB_0080b997;
    *puVar9 = 0;
  }
  pBVar2 = _envIndex;
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    RVar7 = FuncInfo::AcquireTmpRegister(funcInfo);
    pBVar2 = _envIndex;
    EmitModuleExportAccess(_envIndex,sym,LdModuleSlot,RVar7,funcInfo);
    Js::ByteCodeWriter::Reg2(&pBVar2->m_writer,Typeof,local_34,RVar7);
    FuncInfo::ReleaseTmpRegister(funcInfo,RVar7);
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       _envIndex->alloc;
  local_b8 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  local_58 = sym;
  local_60 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  this_01 = &pBVar2->m_writer;
  scopeLocation.index = 0xffffffff;
  scope = (Scope *)0x0;
  local_40 = funcInfo;
  while( true ) {
    pFVar12 = local_40;
    scope = FindScopeForSym(_envIndex,symScope,scope,&local_50,local_40);
    if (scope == this->globalScope) {
      scopeLocation.index = 0xfffffffd;
    }
    else if (local_50 == -1) {
      if (scope->func != pFVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_60 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x159f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar3) goto LAB_0080b997;
        *local_60 = 0;
      }
      scopeLocation = (anon_union_4_2_6390a042_for_DynamicLoadRecord_2)scope->location;
    }
    if (scope == symScope) break;
    if ((scope == (Scope *)0x0) || (uVar4 = *(ushort *)&scope->field_0x44, (uVar4 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x15a9,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar3) goto LAB_0080b997;
      *local_60 = 0;
      uVar4 = *(ushort *)&scope->field_0x44;
    }
    if ((uVar4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x15aa,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar3) goto LAB_0080b997;
      *local_60 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord(&local_6c);
    local_6c.label = Js::ByteCodeWriter::DefineLabel(this_01);
    if (local_58 == (Symbol *)0x0) {
      PVar5 = pid->m_propertyId;
    }
    else {
      PVar5 = Symbol::EnsurePosition(local_58,_envIndex);
    }
    uVar6 = FuncInfo::FindOrAddReferencedPropertyId(pFVar12,PVar5);
    if (scope->scopeType == ScopeType_With) {
      if (local_50 == -1) {
        Js::ByteCodeWriter::BrProperty
                  (this_01,BrOnHasProperty,local_6c.label,scopeLocation.instance,uVar6);
        local_6c.kind = LocalWith;
        local_6c.field_2 = scopeLocation;
      }
      else {
        aVar11.index = local_50 + 1;
        Js::ByteCodeWriter::BrEnvProperty
                  (this_01,BrOnHasEnvProperty,local_6c.label,uVar6,aVar11.index);
        local_6c.kind = EnvWith;
        local_6c.field_2.index = aVar11.index;
      }
    }
    else if (local_50 == -1) {
      Js::ByteCodeWriter::BrLocalProperty(this_01,BrOnHasLocalProperty,local_6c.label,uVar6);
      local_6c.kind = Local;
      local_6c.field_2 = scopeLocation;
    }
    else {
      aVar11.index = local_50 + 1;
      Js::ByteCodeWriter::BrEnvProperty
                (this_01,BrOnHasLocalEnvProperty,local_6c.label,uVar6,aVar11.index);
      local_6c.kind = Env;
      local_6c.field_2.index = aVar11.index;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)local_b8,0);
    ((anon_union_4_2_6390a042_for_DynamicLoadRecord_2 *)
    ((long)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           _vptr_ReadOnlyList +
    (long)(int)recList.
               super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer
    * 0xc + 8))->index = (uint32)local_6c.field_2;
    *(ulong *)((long)recList.
                     super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                     _vptr_ReadOnlyList +
              (long)(int)recList.
                         super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                         .buffer * 0xc) = CONCAT44(local_6c.label,local_6c.kind);
    recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
    _0_4_ = (int)recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer + 1;
  }
  if (local_58 == (Symbol *)0x0) {
    PVar5 = pid->m_propertyId;
LAB_0080b55a:
    if ((_envIndex->flags >> 10 & 1) == 0) {
      if ((_envIndex->flags & 4) == 0) {
        EmitTypeOfFld(_envIndex,pFVar12,PVar5,local_34,0xfffffffd,LdRootFldForTypeOf,false);
        goto LAB_0080b645;
      }
LAB_0080b5bb:
      RVar7 = FuncInfo::GetEnvRegister(pFVar12);
    }
    else {
      if ((((pFVar12->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
         (bVar3 = FuncInfo::IsGlobalFunction(pFVar12), pFVar12 = local_40, !bVar3))
      goto LAB_0080b5bb;
      RVar7 = local_40->frameDisplayRegister;
    }
    EmitTypeOfFld(_envIndex,local_40,PVar5,local_34,RVar7,ScopedLdFldForTypeOf,false);
  }
  else if (((*(ushort *)&local_58->field_0x42 & 1) == 0) || (scope->func != pFVar12)) {
    if ((*(ushort *)&local_58->field_0x42 & 8) != 0) {
      PVar5 = Symbol::EnsurePosition(local_58,_envIndex);
      pFVar12 = local_40;
      goto LAB_0080b55a;
    }
    bVar3 = Symbol::IsInSlot(local_58,_envIndex,pFVar12,false);
    pFVar12 = local_40;
    if (bVar3 || local_50 != -1) {
      recList._44_4_ = Symbol::EnsureScopeSlot(local_58,_envIndex,local_40);
      local_4a = FuncInfo::FindOrAddSlotProfileId(pFVar12,scope,recList._44_4_);
      this_00 = pFVar12;
      RVar7 = FuncInfo::AcquireTmpRegister(pFVar12);
      local_4b = NeedCheckBlockVar((ByteCodeGenerator *)this_00,local_58,scope,pFVar12);
      op = GetLdSlotOp((ByteCodeGenerator *)this_00,scope,local_50,scopeLocation.instance,pFVar12);
      slotId = recList._44_4_ + (~*(uint *)&sym->scope->field_0x44 & 2);
      if (local_50 == -1) {
        if ((scopeLocation.index == 0xffffffff) ||
           ((scopeLocation.index != local_40->frameSlotsRegister &&
            (scopeLocation.index != local_40->frameObjRegister)))) {
          uVar6 = scope->innerScopeIndex;
          if (uVar6 != 0xffffffff) goto LAB_0080b495;
          if ((scope->field_0x44 & 2) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_60 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x1614,"(scope->GetIsObject())","scope->GetIsObject()");
            if (!bVar3) {
LAB_0080b997:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *local_60 = 0;
          }
          Js::ByteCodeWriter::Slot(this_01,op,RVar7,scopeLocation.instance,slotId,local_4a);
        }
        else {
          Js::ByteCodeWriter::SlotI1(this_01,op,RVar7,slotId,local_4a);
        }
      }
      else {
        uVar6 = local_50 + 1;
LAB_0080b495:
        Js::ByteCodeWriter::SlotI2(this_01,op,RVar7,uVar6,slotId,local_4a);
      }
      if (local_4b != '\0') {
        Js::ByteCodeWriter::Reg1(this_01,ChkUndecl,RVar7);
      }
      Js::ByteCodeWriter::Reg2(this_01,Typeof,local_34,RVar7);
      FuncInfo::ReleaseTmpRegister(local_40,RVar7);
    }
    else {
      Js::ByteCodeWriter::Reg2(this_01,Typeof,local_34,local_58->location);
    }
  }
  else {
    bVar3 = Symbol::IsInSlot(local_58,_envIndex,pFVar12,false);
    if (bVar3) {
      PVar5 = Symbol::EnsureScopeSlot(local_58,_envIndex,local_40);
      FuncInfo::FindOrAddSlotProfileId(local_40,scope,PVar5);
    }
    EmitUseBeforeDeclarationRuntimeError(_envIndex,local_34);
  }
LAB_0080b645:
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer == 0) goto LAB_0080b893;
  labelID = Js::ByteCodeWriter::DefineLabel(this_01);
  Js::ByteCodeWriter::Br(this_01,labelID);
  index = 0;
LAB_0080b669:
  if (local_58 == (Symbol *)0x0) {
    PVar5 = pid->m_propertyId;
  }
  else {
    PVar5 = Symbol::EnsurePosition(local_58,_envIndex);
  }
  pTVar10 = JsUtil::
            List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)local_b8,index);
  Js::ByteCodeWriter::MarkLabel(this_01,pTVar10->label);
  pTVar10 = JsUtil::
            List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)local_b8,index);
  switch(pTVar10->kind) {
  case Local:
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    EmitTypeOfFld(_envIndex,local_40,PVar5,local_34,(pTVar10->field_2).instance,LdLocalFld,true);
    goto LAB_0080b86a;
  case Env:
    RVar7 = FuncInfo::AcquireTmpRegister(local_40);
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    Js::ByteCodeWriter::SlotI1(this_01,LdEnvObj,RVar7,(pTVar10->field_2).index);
    EmitTypeOfFld(_envIndex,local_40,PVar5,local_34,RVar7,LdFldForTypeOf,true);
    break;
  case LocalWith:
    RVar7 = FuncInfo::AcquireTmpRegister(local_40);
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    Js::ByteCodeWriter::Reg2(this_01,UnwrapWithObj,RVar7,(pTVar10->field_2).instance);
    EmitTypeOfFld(_envIndex,local_40,PVar5,local_34,RVar7,LdFldForTypeOf,true);
    break;
  case EnvWith:
    RVar7 = FuncInfo::AcquireTmpRegister(local_40);
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    Js::ByteCodeWriter::SlotI1(this_01,LdEnvObj,RVar7,(pTVar10->field_2).index);
    Js::ByteCodeWriter::Reg2(this_01,UnwrapWithObj,RVar7,RVar7);
    EmitTypeOfFld(_envIndex,local_40,PVar5,local_34,RVar7,LdFldForTypeOf,true);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_60 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x164d,"((0))","(0)");
    if (bVar3) {
      *local_60 = 0;
      goto LAB_0080b86a;
    }
    goto LAB_0080b997;
  }
  FuncInfo::ReleaseTmpRegister(local_40,RVar7);
LAB_0080b86a:
  if (index == (int)recList.
                    super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                    buffer + -1) {
    Js::ByteCodeWriter::MarkLabel(this_01,labelID);
LAB_0080b893:
    local_b8 = (undefined1  [8])&PTR_IsReadOnly_014dd580;
    if (recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList != (_func_int **)0x0) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 recList.
                 super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                 _16_8_,recList.
                        super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                        ._vptr_ReadOnlyList,
                 (long)(int)recList.
                            super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>
                            .alloc * 0xc);
    }
    return;
  }
  Js::ByteCodeWriter::Br(this_01,labelID);
  index = index + 1;
  goto LAB_0080b669;
}

Assistant:

void ByteCodeGenerator::EmitPropTypeof(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, tmpLocation, funcInfo);
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->frameDisplayRegister, Js::OpCode::ScopedLdFldForTypeOf);
            }
            else
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
        }
        else
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, ByteCodeGenerator::RootObjectRegister, Js::OpCode::LdRootFldForTypeOf);
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, tmpLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, tmpLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, tmpLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, tmpLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, tmpLocation);
        }

        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
    }
    else
    {
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, sym->GetLocation());
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, recList.Item(i).instance, Js::OpCode::LdLocalFld, true);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}